

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O2

bool __thiscall
cmFileInstaller::InstallFile
          (cmFileInstaller *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  bool bVar1;
  __type _Var2;
  byte bVar3;
  Status SVar4;
  string *this_00;
  bool bVar5;
  string toDir;
  string newFromFile;
  string reassembled;
  string e;
  
  if (this->InstallMode == COPY) {
    bVar5 = cmFileCopier::InstallFile(&this->super_cmFileCopier,fromFile,toFile,match_properties);
    return bVar5;
  }
  newFromFile._M_dataplus._M_p = (pointer)&newFromFile.field_2;
  newFromFile._M_string_length = 0;
  newFromFile.field_2._M_local_buf[0] = '\0';
  if (this->InstallMode - REL_SYMLINK < 4) {
    cmsys::SystemTools::GetParentDirectory(&toDir,toFile);
    cmSystemTools::ForceToRelativePath(&reassembled,&toDir,fromFile);
    this_00 = &reassembled;
    std::__cxx11::string::operator=((string *)&newFromFile,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    cmsys::SystemTools::CollapseFullPath(&reassembled,&newFromFile,&toDir);
    bVar1 = cmsys::SystemTools::ComparePath(&reassembled,fromFile);
    bVar5 = true;
    if (!bVar1) {
      if (this->InstallMode - SYMLINK < 2) {
        std::__cxx11::string::_M_assign((string *)&newFromFile);
      }
      else if (this->InstallMode == REL_SYMLINK_OR_COPY) {
        bVar5 = cmFileCopier::InstallFile
                          (&this->super_cmFileCopier,fromFile,toFile,match_properties);
        this_00 = (string *)(ulong)bVar5;
        bVar5 = false;
      }
      else {
        cmStrCat<char_const*&,char_const(&)[49],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string_const&,char_const(&)[3]>
                  (&e,&(this->super_cmFileCopier).Name,
                   (char (*) [49])" cannot determine relative path for symlink to \"",&newFromFile,
                   (char (*) [7])"\" at \"",toFile,(char (*) [3])0x6b36dc);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        std::__cxx11::string::~string((string *)&e);
        bVar5 = false;
        this_00 = (string *)0x0;
      }
    }
    bVar3 = (byte)this_00;
    std::__cxx11::string::~string((string *)&reassembled);
    std::__cxx11::string::~string((string *)&toDir);
    if (!bVar5) goto LAB_00345374;
  }
  else {
    std::__cxx11::string::_M_assign((string *)&newFromFile);
  }
  bVar5 = true;
  if ((this->super_cmFileCopier).Always == false) {
    toDir._M_dataplus._M_p = (pointer)&toDir.field_2;
    toDir._M_string_length = 0;
    toDir.field_2._M_local_buf[0] = '\0';
    SVar4 = cmsys::SystemTools::ReadSymlink(toFile,&toDir);
    bVar5 = true;
    if (SVar4.Kind_ == Success) {
      _Var2 = std::operator==(&newFromFile,&toDir);
      bVar5 = !_Var2;
    }
    std::__cxx11::string::~string((string *)&toDir);
  }
  (*(this->super_cmFileCopier)._vptr_cmFileCopier[5])(this,toFile,2,(ulong)bVar5);
  bVar3 = 1;
  if (bVar5 != false) {
    cmsys::SystemTools::RemoveFile(toFile);
    cmsys::SystemTools::GetFilenamePath(&toDir,toFile);
    cmsys::SystemTools::MakeDirectory(&toDir,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)&toDir);
    SVar4 = cmSystemTools::CreateSymlink(&newFromFile,toFile);
    if (SVar4.Kind_ != Success) {
      if ((this->InstallMode < (SYMLINK_OR_COPY|ABS_SYMLINK)) &&
         ((0x54U >> (this->InstallMode & 0x1f) & 1) != 0)) {
        bVar3 = cmFileCopier::InstallFile
                          (&this->super_cmFileCopier,&newFromFile,toFile,match_properties);
      }
      else {
        cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
        cmStrCat<char_const*&,char_const(&)[28],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string,char_const(&)[3]>
                  (&toDir,&(this->super_cmFileCopier).Name,
                   (char (*) [28])" cannot create symlink to \"",&newFromFile,
                   (char (*) [7])"\" at \"",toFile,(char (*) [4])0x674eab,&reassembled,
                   (char (*) [3])0x6b36dc);
        std::__cxx11::string::~string((string *)&reassembled);
        std::__cxx11::string::_M_assign((string *)&((this->super_cmFileCopier).Status)->Error);
        std::__cxx11::string::~string((string *)&toDir);
        bVar3 = 0;
      }
    }
  }
LAB_00345374:
  std::__cxx11::string::~string((string *)&newFromFile);
  return (bool)(bVar3 & 1);
}

Assistant:

bool cmFileInstaller::InstallFile(const std::string& fromFile,
                                  const std::string& toFile,
                                  MatchProperties match_properties)
{
  if (this->InstallMode == cmInstallMode::COPY) {
    return this->cmFileCopier::InstallFile(fromFile, toFile, match_properties);
  }

  std::string newFromFile;

  if (this->InstallMode == cmInstallMode::REL_SYMLINK ||
      this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
      this->InstallMode == cmInstallMode::SYMLINK ||
      this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
    // Try to get a relative path.
    std::string toDir = cmSystemTools::GetParentDirectory(toFile);
    newFromFile = cmSystemTools::ForceToRelativePath(toDir, fromFile);

    // Double check that we can restore the original path.
    std::string reassembled =
      cmSystemTools::CollapseFullPath(newFromFile, toDir);
    if (!cmSystemTools::ComparePath(reassembled, fromFile)) {
      if (this->InstallMode == cmInstallMode::SYMLINK ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // User does not mind, silently proceed with absolute path.
        newFromFile = fromFile;
      } else if (this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY) {
        // User expects a relative symbolic link or a copy.
        // Since an absolute symlink won't do, copy instead.
        return this->cmFileCopier::InstallFile(fromFile, toFile,
                                               match_properties);
      } else {
        // We cannot meet user's expectation (REL_SYMLINK)
        auto e = cmStrCat(this->Name,
                          " cannot determine relative path for symlink to \"",
                          newFromFile, "\" at \"", toFile, "\".");
        this->Status.SetError(e);
        return false;
      }
    }
  } else {
    newFromFile = fromFile; // stick with absolute path
  }

  // Compare the symlink value to that at the destination if not
  // always installing.
  bool copy = true;
  if (!this->Always) {
    std::string oldSymlinkTarget;
    if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
      if (newFromFile == oldSymlinkTarget) {
        copy = false;
      }
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeLink, copy);

  if (copy) {
    // Remove the destination file so we can always create the symlink.
    cmSystemTools::RemoveFile(toFile);

    // Create destination directory if it doesn't exist
    cmSystemTools::MakeDirectory(cmSystemTools::GetFilenamePath(toFile));

    // Create the symlink.
    if (!cmSystemTools::CreateSymlink(newFromFile, toFile)) {
      if (this->InstallMode == cmInstallMode::ABS_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::REL_SYMLINK_OR_COPY ||
          this->InstallMode == cmInstallMode::SYMLINK_OR_COPY) {
        // Failed to create a symbolic link, fall back to copying.
        return this->cmFileCopier::InstallFile(newFromFile, toFile,
                                               match_properties);
      }

      auto e = cmStrCat(this->Name, " cannot create symlink to \"",
                        newFromFile, "\" at \"", toFile,
                        "\": ", cmSystemTools::GetLastSystemError(), "\".");
      this->Status.SetError(e);
      return false;
    }
  }

  return true;
}